

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_api_suite::test_clear(void)

{
  undefined4 local_4c;
  size_type local_48;
  undefined4 local_3c;
  size_type local_38 [2];
  undefined1 local_28 [8];
  moment<double,_4> filter;
  
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_28);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             1.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             2.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             3.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             4.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             5.0);
  local_38[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::size
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_3c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x37,"void mean_api_suite::test_clear()",local_38,&local_3c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::clear
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28);
  local_48 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *
                        )local_28);
  local_4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x39,"void mean_api_suite::test_clear()",&local_48,&local_4c);
  return;
}

Assistant:

void test_clear()
{
    interim::moment<double, 4> filter;
    filter.push(1.0);
    filter.push(2.0);
    filter.push(3.0);
    filter.push(4.0);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    filter.clear();
    TRIAL_TEST_EQ(filter.size(), 0);
}